

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O2

void png_set_IHDR(png_const_structrp png_ptr,png_inforp info_ptr,png_uint_32 width,
                 png_uint_32 height,int bit_depth,int color_type,int interlace_type,
                 int compression_type,int filter_type)

{
  png_byte pVar1;
  byte bVar2;
  ulong uVar3;
  
  if (info_ptr != (png_inforp)0x0 && png_ptr != (png_const_structrp)0x0) {
    info_ptr->width = width;
    info_ptr->height = height;
    info_ptr->bit_depth = (png_byte)bit_depth;
    info_ptr->color_type = (png_byte)color_type;
    info_ptr->compression_type = (png_byte)compression_type;
    info_ptr->filter_type = (png_byte)filter_type;
    info_ptr->interlace_type = (png_byte)interlace_type;
    png_check_IHDR(png_ptr,width,height,bit_depth & 0xff,color_type & 0xff,interlace_type & 0xff,
                   compression_type & 0xff,filter_type & 0xff);
    bVar2 = info_ptr->color_type;
    if (bVar2 == 3) {
      info_ptr->channels = '\x01';
      pVar1 = '\x01';
    }
    else {
      pVar1 = (bVar2 & 2) + 1;
      info_ptr->channels = pVar1;
      if ((bVar2 & 4) != 0) {
        pVar1 = (bVar2 & 2) + 2;
        info_ptr->channels = pVar1;
      }
    }
    bVar2 = info_ptr->bit_depth * pVar1;
    info_ptr->pixel_depth = bVar2;
    if (bVar2 < 8) {
      uVar3 = (ulong)bVar2 * (ulong)width + 7 >> 3;
    }
    else {
      uVar3 = (ulong)(bVar2 >> 3) * (ulong)width;
    }
    info_ptr->rowbytes = uVar3;
  }
  return;
}

Assistant:

void PNGAPI
png_set_IHDR(png_const_structrp png_ptr, png_inforp info_ptr,
    png_uint_32 width, png_uint_32 height, int bit_depth,
    int color_type, int interlace_type, int compression_type,
    int filter_type)
{
   png_debug1(1, "in %s storage function", "IHDR");

   if (png_ptr == NULL || info_ptr == NULL)
      return;

   info_ptr->width = width;
   info_ptr->height = height;
   info_ptr->bit_depth = (png_byte)bit_depth;
   info_ptr->color_type = (png_byte)color_type;
   info_ptr->compression_type = (png_byte)compression_type;
   info_ptr->filter_type = (png_byte)filter_type;
   info_ptr->interlace_type = (png_byte)interlace_type;

   png_check_IHDR (png_ptr, info_ptr->width, info_ptr->height,
       info_ptr->bit_depth, info_ptr->color_type, info_ptr->interlace_type,
       info_ptr->compression_type, info_ptr->filter_type);

   if (info_ptr->color_type == PNG_COLOR_TYPE_PALETTE)
      info_ptr->channels = 1;

   else if ((info_ptr->color_type & PNG_COLOR_MASK_COLOR) != 0)
      info_ptr->channels = 3;

   else
      info_ptr->channels = 1;

   if ((info_ptr->color_type & PNG_COLOR_MASK_ALPHA) != 0)
      info_ptr->channels++;

   info_ptr->pixel_depth = (png_byte)(info_ptr->channels * info_ptr->bit_depth);

   info_ptr->rowbytes = PNG_ROWBYTES(info_ptr->pixel_depth, width);
}